

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code-generator.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t seedSize;
  uint32_t nonce;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  AssemblyGeneratorX86 asmX86;
  Blake2Generator gen;
  SuperscalarProgram p;
  undefined1 local_1288 [128];
  ios_base local_1208 [296];
  Blake2Generator local_10e0;
  SuperscalarProgram local_1098;
  
  uVar6 = (ulong)(uint)argc;
  if (argc < 1) {
LAB_0010adb1:
    bVar3 = false;
  }
  else {
    iVar4 = strcmp(*argv,"--softAes");
    bVar3 = true;
    if (iVar4 != 0) {
      uVar7 = 0;
      do {
        if (uVar6 - 1 == uVar7) goto LAB_0010adb1;
        iVar4 = strcmp(argv[uVar7 + 1],"--softAes");
        uVar7 = uVar7 + 1;
      } while (iVar4 != 0);
      if (uVar6 <= uVar7) goto LAB_0010adb1;
    }
  }
  if (argc < 1) {
LAB_0010adff:
    bVar2 = false;
  }
  else {
    iVar4 = strcmp(*argv,"--genAsm");
    bVar2 = true;
    if (iVar4 != 0) {
      uVar7 = 0;
      do {
        if (uVar6 - 1 == uVar7) goto LAB_0010adff;
        iVar4 = strcmp(argv[uVar7 + 1],"--genAsm");
        uVar7 = uVar7 + 1;
      } while (iVar4 != 0);
      if (uVar6 <= uVar7) goto LAB_0010adff;
    }
  }
  if (1 < argc) {
    bVar1 = true;
    uVar7 = 1;
    do {
      iVar4 = strcmp(argv[uVar7 - 1],"--nonce");
      if ((iVar4 == 0) && (uVar5 = atoi(argv[uVar7]), 0 < (int)uVar5)) {
        seedSize = (size_t)uVar5;
        if (bVar1) goto LAB_0010ae71;
        break;
      }
      bVar1 = (long)uVar7 < (long)(int)(argc - 1U);
      bVar8 = uVar7 != argc - 1U;
      uVar7 = uVar7 + 1;
    } while (bVar8);
  }
  seedSize = 1000;
LAB_0010ae71:
  if (argc < 1) {
LAB_0010aec1:
    bVar1 = false;
  }
  else {
    iVar4 = strcmp(*argv,"--genNative");
    bVar1 = true;
    if (iVar4 != 0) {
      uVar7 = 0;
      do {
        if (uVar6 - 1 == uVar7) goto LAB_0010aec1;
        iVar4 = strcmp(argv[uVar7 + 1],"--genNative");
        uVar7 = uVar7 + 1;
      } while (iVar4 != 0);
      if (uVar6 <= uVar7) goto LAB_0010aec1;
    }
  }
  if (argc < 1) {
LAB_0010af90:
    nonce = (uint32_t)seedSize;
    if (bVar2) {
      if (bVar3) {
        generateAsm<true>(nonce);
      }
      else {
        generateAsm<false>(nonce);
      }
    }
    else if (bVar1) {
      if (bVar3) {
        generateNative<true>(nonce);
      }
      else {
        generateNative<false>(nonce);
      }
    }
    else {
      printUsage(*argv);
    }
  }
  else {
    iVar4 = strcmp(*argv,"--genSuperscalar");
    if (iVar4 != 0) {
      uVar7 = 0;
      do {
        if (uVar6 - 1 == uVar7) goto LAB_0010af90;
        iVar4 = strcmp(argv[uVar7 + 1],"--genSuperscalar");
        uVar7 = uVar7 + 1;
      } while (iVar4 != 0);
      if (uVar6 <= uVar7) goto LAB_0010af90;
    }
    randomx::Blake2Generator::Blake2Generator(&local_10e0,seed,seedSize,0);
    randomx::generateSuperscalar(&local_1098,&local_10e0);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1288);
    randomx::AssemblyGeneratorX86::generateAsm((AssemblyGeneratorX86 *)local_1288,&local_1098);
    std::ostream::operator<<(&std::cout,(streambuf *)(local_1288 + 0x18));
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1288);
    std::ios_base::~ios_base(local_1208);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	bool softAes, genAsm, genNative, genSuperscalar;
	int nonce;

	readOption("--softAes", argc, argv, softAes);
	readOption("--genAsm", argc, argv, genAsm);
	readIntOption("--nonce", argc, argv, nonce, 1000);
	readOption("--genNative", argc, argv, genNative);
	readOption("--genSuperscalar", argc, argv, genSuperscalar);

	if (genSuperscalar) {
		randomx::SuperscalarProgram p;
		randomx::Blake2Generator gen(seed, nonce);
		randomx::generateSuperscalar(p, gen);
		randomx::AssemblyGeneratorX86 asmX86;
		asmX86.generateAsm(p);
		asmX86.printCode(std::cout);
		return 0;
	}

	if (genAsm) {
		if (softAes)
			generateAsm<true>(nonce);
		else
			generateAsm<false>(nonce);
		return 0;
	}

	if (genNative) {
		if (softAes)
			generateNative<true>(nonce);
		else
			generateNative<false>(nonce);
		return 0;
	}

	printUsage(argv[0]);
	return 0;
}